

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void statGet(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Stat4Sample *pSVar1;
  uint uVar2;
  Stat4Accum *p;
  ulong uVar3;
  char *zBuf;
  tRowcnt *ptVar4;
  char *z;
  char *pcVar5;
  int i;
  long lVar6;
  
  p = (Stat4Accum *)sqlite3_value_blob(*argv);
  uVar3 = sqlite3VdbeIntValue(argv[1]);
  switch(uVar3 & 0xffffffff) {
  case 0:
    zBuf = (char *)sqlite3MallocZero((long)(p->nKeyCol * 0x19 + 0x19));
    if (zBuf == (char *)0x0) goto LAB_00182d5b;
    sqlite3_snprintf(0x18,zBuf,"%llu",(ulong)p->nRow);
    uVar2 = sqlite3Strlen30(zBuf);
    pcVar5 = zBuf + uVar2;
    for (lVar6 = 0; lVar6 < p->nKeyCol; lVar6 = lVar6 + 1) {
      uVar3 = (ulong)((p->current).anDLt[lVar6] + 1);
      sqlite3_snprintf(0x18,pcVar5," %llu",((p->nRow + uVar3) - 1) / uVar3);
      uVar2 = sqlite3Strlen30(pcVar5);
      pcVar5 = pcVar5 + uVar2;
    }
    goto LAB_00182d83;
  case 1:
    uVar2 = p->iGet;
    if ((int)uVar2 < 0) {
      uVar2 = 0;
      samplePushPrevious(p,0);
      p->iGet = 0;
    }
    if (p->nSample <= (int)uVar2) {
      return;
    }
    pSVar1 = p->a;
    if (pSVar1[uVar2].nRowid == 0) {
      sqlite3_result_int64(context,pSVar1[uVar2].u.iRowid);
      return;
    }
    sqlite3_result_blob(context,pSVar1[uVar2].u.aRowid,pSVar1[uVar2].nRowid,
                        (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  case 2:
    ptVar4 = p->a[p->iGet].anEq;
    break;
  case 3:
    ptVar4 = p->a[p->iGet].anLt;
    break;
  default:
    ptVar4 = p->a[p->iGet].anDLt;
    p->iGet = p->iGet + 1;
  }
  zBuf = (char *)sqlite3MallocZero((long)p->nCol * 0x19);
  if (zBuf == (char *)0x0) {
LAB_00182d5b:
    sqlite3_result_error_nomem(context);
    return;
  }
  pcVar5 = zBuf;
  for (lVar6 = 0; lVar6 < p->nCol; lVar6 = lVar6 + 1) {
    sqlite3_snprintf(0x18,pcVar5,"%llu ",(ulong)ptVar4[lVar6]);
    uVar2 = sqlite3Strlen30(pcVar5);
    pcVar5 = pcVar5 + uVar2;
  }
  pcVar5[-1] = '\0';
LAB_00182d83:
  sqlite3_result_text(context,zBuf,-1,sqlite3_free);
  return;
}

Assistant:

static void statGet(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  Stat4Accum *p = (Stat4Accum*)sqlite3_value_blob(argv[0]);
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  /* STAT3 and STAT4 have a parameter on this routine. */
  int eCall = sqlite3_value_int(argv[1]);
  assert( argc==2 );
  assert( eCall==STAT_GET_STAT1 || eCall==STAT_GET_NEQ 
       || eCall==STAT_GET_ROWID || eCall==STAT_GET_NLT
       || eCall==STAT_GET_NDLT 
  );
  if( eCall==STAT_GET_STAT1 )
#else
  assert( argc==1 );
#endif
  {
    /* Return the value to store in the "stat" column of the sqlite_stat1
    ** table for this index.
    **
    ** The value is a string composed of a list of integers describing 
    ** the index. The first integer in the list is the total number of 
    ** entries in the index. There is one additional integer in the list 
    ** for each indexed column. This additional integer is an estimate of
    ** the number of rows matched by a stabbing query on the index using
    ** a key with the corresponding number of fields. In other words,
    ** if the index is on columns (a,b) and the sqlite_stat1 value is 
    ** "100 10 2", then SQLite estimates that:
    **
    **   * the index contains 100 rows,
    **   * "WHERE a=?" matches 10 rows, and
    **   * "WHERE a=? AND b=?" matches 2 rows.
    **
    ** If D is the count of distinct values and K is the total number of 
    ** rows, then each estimate is computed as:
    **
    **        I = (K+D-1)/D
    */
    char *z;
    int i;

    char *zRet = sqlite3MallocZero( (p->nKeyCol+1)*25 );
    if( zRet==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }

    sqlite3_snprintf(24, zRet, "%llu", (u64)p->nRow);
    z = zRet + sqlite3Strlen30(zRet);
    for(i=0; i<p->nKeyCol; i++){
      u64 nDistinct = p->current.anDLt[i] + 1;
      u64 iVal = (p->nRow + nDistinct - 1) / nDistinct;
      sqlite3_snprintf(24, z, " %llu", iVal);
      z += sqlite3Strlen30(z);
      assert( p->current.anEq[i] );
    }
    assert( z[0]=='\0' && z>zRet );

    sqlite3_result_text(context, zRet, -1, sqlite3_free);
  }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  else if( eCall==STAT_GET_ROWID ){
    if( p->iGet<0 ){
      samplePushPrevious(p, 0);
      p->iGet = 0;
    }
    if( p->iGet<p->nSample ){
      Stat4Sample *pS = p->a + p->iGet;
      if( pS->nRowid==0 ){
        sqlite3_result_int64(context, pS->u.iRowid);
      }else{
        sqlite3_result_blob(context, pS->u.aRowid, pS->nRowid,
                            SQLITE_TRANSIENT);
      }
    }
  }else{
    tRowcnt *aCnt = 0;

    assert( p->iGet<p->nSample );
    switch( eCall ){
      case STAT_GET_NEQ:  aCnt = p->a[p->iGet].anEq; break;
      case STAT_GET_NLT:  aCnt = p->a[p->iGet].anLt; break;
      default: {
        aCnt = p->a[p->iGet].anDLt; 
        p->iGet++;
        break;
      }
    }

    if( IsStat3 ){
      sqlite3_result_int64(context, (i64)aCnt[0]);
    }else{
      char *zRet = sqlite3MallocZero(p->nCol * 25);
      if( zRet==0 ){
        sqlite3_result_error_nomem(context);
      }else{
        int i;
        char *z = zRet;
        for(i=0; i<p->nCol; i++){
          sqlite3_snprintf(24, z, "%llu ", (u64)aCnt[i]);
          z += sqlite3Strlen30(z);
        }
        assert( z[0]=='\0' && z>zRet );
        z[-1] = '\0';
        sqlite3_result_text(context, zRet, -1, sqlite3_free);
      }
    }
  }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */
#ifndef SQLITE_DEBUG
  UNUSED_PARAMETER( argc );
#endif
}